

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

image_u8 * __thiscall image_u8::crop(image_u8 *this,uint32_t new_width,uint32_t new_height)

{
  uint32_t y;
  uint uVar1;
  uint32_t x;
  uint uVar2;
  image_u8 new_image;
  image_u8 local_38;
  
  if ((this->m_width != new_width) || (this->m_height != new_height)) {
    image_u8(&local_38,new_width,new_height);
    if (this->m_width < new_width) {
      new_width = this->m_width;
    }
    if (this->m_height < new_height) {
      new_height = this->m_height;
    }
    for (uVar1 = 0; uVar1 != new_height; uVar1 = uVar1 + 1) {
      for (uVar2 = 0; new_width != uVar2; uVar2 = uVar2 + 1) {
        *(undefined4 *)
         local_38.m_pixels.super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl
         .super__Vector_impl_data._M_start[local_38.m_width * uVar1 + uVar2].m_c =
             *(undefined4 *)
              (this->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>.
              _M_impl.super__Vector_impl_data._M_start[this->m_width * uVar1 + uVar2].m_c;
      }
    }
    this = swap(this,&local_38);
    std::_Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>::~_Vector_base
              ((_Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_> *)&local_38);
  }
  return this;
}

Assistant:

image_u8& crop(uint32_t new_width, uint32_t new_height)
	{
		if ((m_width == new_width) && (m_height == new_height))
			return *this;

		image_u8 new_image(new_width, new_height);

		const uint32_t w = std::min(m_width, new_width);
		const uint32_t h = std::min(m_height, new_height);

		for (uint32_t y = 0; y < h; y++)
			for (uint32_t x = 0; x < w; x++)
				new_image(x, y) = (*this)(x, y);

		return swap(new_image);
	}